

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_scanner.cpp
# Opt level: O2

void __thiscall duckdb::CSVFileScan::SetStart(CSVFileScan *this)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  idx_t iVar1;
  CSVStateMachine *pCVar2;
  CSVIterator *pCVar3;
  long lVar4;
  CSVIterator *pCVar5;
  ulong uVar6;
  ulong rows_to_skip;
  byte bVar7;
  __shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2> _Stack_168;
  __shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> local_158;
  SkipScanner skip_scanner;
  
  bVar7 = 0;
  iVar1 = CSVReaderOptions::GetSkipRows(&this->options);
  this_00 = &this->state_machine;
  pCVar2 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  uVar6 = (pCVar2->dialect_options).header.value + iVar1;
  pCVar2 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  iVar1 = (pCVar2->dialect_options).rows_until_header;
  pCVar2 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  rows_to_skip = (pCVar2->dialect_options).header.value + iVar1;
  if (rows_to_skip < uVar6) {
    rows_to_skip = uVar6;
  }
  if (rows_to_skip == 0) {
    (this->start_iterator).first_one = true;
  }
  else {
    ::std::__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_158,
               (__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> *)
               &this->buffer_manager);
    ::std::__shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_168,
               (__shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2> *)
               &this->error_handler);
    SkipScanner::SkipScanner
              (&skip_scanner,(shared_ptr<duckdb::CSVBufferManager,_true> *)&local_158,this_00,
               (shared_ptr<duckdb::CSVErrorHandler,_true> *)&_Stack_168,rows_to_skip);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_168._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
    SkipScanner::ParseChunk(&skip_scanner);
    pCVar3 = BaseScanner::GetIterator(&skip_scanner.super_BaseScanner);
    pCVar5 = &this->start_iterator;
    for (lVar4 = 0x41; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(char *)&(pCVar5->pos).buffer_idx = (char)(pCVar3->pos).buffer_idx;
      pCVar3 = (CSVIterator *)((long)pCVar3 + (ulong)bVar7 * -2 + 1);
      pCVar5 = (CSVIterator *)((long)pCVar5 + (ulong)bVar7 * -2 + 1);
    }
    BaseScanner::~BaseScanner(&skip_scanner.super_BaseScanner);
  }
  return;
}

Assistant:

void CSVFileScan::SetStart() {
	idx_t rows_to_skip = options.GetSkipRows() + state_machine->dialect_options.header.GetValue();
	rows_to_skip = std::max(rows_to_skip, state_machine->dialect_options.rows_until_header +
	                                          state_machine->dialect_options.header.GetValue());
	if (rows_to_skip == 0) {
		start_iterator.first_one = true;
		return;
	}
	SkipScanner skip_scanner(buffer_manager, state_machine, error_handler, rows_to_skip);
	skip_scanner.ParseChunk();
	start_iterator = skip_scanner.GetIterator();
}